

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_iter.cc
# Opt level: O2

Iterator *
leveldb::NewDBIterator
          (DBImpl *db,Comparator *user_key_comparator,Iterator *internal_iter,
          SequenceNumber sequence,uint32_t seed)

{
  long lVar1;
  DBIter *this;
  size_t sVar2;
  uint uVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this = (DBIter *)operator_new(0xa8);
  Iterator::Iterator((Iterator *)this);
  (this->super_Iterator)._vptr_Iterator = (_func_int **)&PTR__DBIter_011484f0;
  this->db_ = db;
  this->user_comparator_ = user_key_comparator;
  this->iter_ = internal_iter;
  this->sequence_ = sequence;
  (this->status_).state_ = (char *)0x0;
  (this->saved_key_)._M_dataplus._M_p = (pointer)&(this->saved_key_).field_2;
  (this->saved_key_)._M_string_length = 0;
  (this->saved_key_).field_2._M_local_buf[0] = '\0';
  (this->saved_value_)._M_dataplus._M_p = (pointer)&(this->saved_value_).field_2;
  (this->saved_value_)._M_string_length = 0;
  (this->saved_value_).field_2._M_local_buf[0] = '\0';
  this->direction_ = kForward;
  this->valid_ = false;
  uVar3 = seed & 0x7fffffff;
  (this->rnd_).seed_ = uVar3;
  if ((uVar3 == 0x7fffffff) || (uVar3 == 0)) {
    (this->rnd_).seed_ = 1;
  }
  sVar2 = anon_unknown_3::DBIter::RandomCompactionPeriod(this);
  this->bytes_until_read_sampling_ = sVar2;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return &this->super_Iterator;
  }
  __stack_chk_fail();
}

Assistant:

Iterator* NewDBIterator(DBImpl* db, const Comparator* user_key_comparator,
                        Iterator* internal_iter, SequenceNumber sequence,
                        uint32_t seed) {
  return new DBIter(db, user_key_comparator, internal_iter, sequence, seed);
}